

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void get_level(d_level *newlevel,int levnum)

{
  int iVar1;
  char local_21;
  branch *pbStack_20;
  xchar dgn;
  branch *br;
  int levnum_local;
  d_level *newlevel_local;
  
  local_21 = u.uz.dnum;
  if (levnum < 1) {
    br._4_1_ = u.uz.dlevel;
  }
  else if (dungeons[u.uz.dnum].depth_start + (int)dungeons[u.uz.dnum].num_dunlevs + -1 < levnum) {
    br._4_1_ = dungeons[u.uz.dnum].num_dunlevs;
  }
  else {
    iVar1 = dungeons[u.uz.dnum].depth_start;
    while (levnum < iVar1) {
      for (pbStack_20 = branches;
          (pbStack_20 != (branch *)0x0 && ((pbStack_20->end2).dnum != local_21));
          pbStack_20 = pbStack_20->next) {
      }
      if (pbStack_20 == (branch *)0x0) {
        panic("get_level: can\'t find parent dungeon");
      }
      local_21 = (pbStack_20->end1).dnum;
      iVar1 = dungeons[local_21].depth_start;
    }
    br._4_1_ = ((char)levnum - (char)dungeons[local_21].depth_start) + '\x01';
  }
  newlevel->dnum = local_21;
  newlevel->dlevel = br._4_1_;
  return;
}

Assistant:

void get_level(d_level *newlevel, int levnum)
{
	branch *br;
	xchar dgn = u.uz.dnum;

	if (levnum <= 0) {
	    /* can only currently happen in endgame */
	    levnum = u.uz.dlevel;
	} else if (levnum > dungeons[dgn].depth_start
			    + dungeons[dgn].num_dunlevs - 1) {
	    /* beyond end of dungeon, jump to last level */
	    levnum = dungeons[dgn].num_dunlevs;
	} else {
	    /* The desired level is in this dungeon or a "higher" one. */

	    /*
	     * Branch up the tree until we reach a dungeon that contains the
	     * levnum.
	     */
	    if (levnum < dungeons[dgn].depth_start) {

		do {
		    /*
		     * Find the parent dungeon of this dungeon.
		     *
		     * This assumes that end2 is always the "child" and it is
		     * unique.
		     */
		    for (br = branches; br; br = br->next)
			if (br->end2.dnum == dgn) break;
		    if (!br)
			panic("get_level: can't find parent dungeon");

		    dgn = br->end1.dnum;
		} while (levnum < dungeons[dgn].depth_start);
	    }

	    /* We're within the same dungeon; calculate the level. */
	    levnum = levnum - dungeons[dgn].depth_start + 1;
	}

	newlevel->dnum = dgn;
	newlevel->dlevel = levnum;
}